

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O3

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::DuckSchemaEntry::CreateCopyFunction
          (DuckSchemaEntry *this,CatalogTransaction transaction,CreateCopyFunctionInfo *info)

{
  bool bVar1;
  Catalog *catalog;
  CopyFunctionCatalogEntry *this_00;
  pointer pCVar2;
  optional_ptr<duckdb::CatalogEntry,_true> oVar3;
  _Head_base<0UL,_duckdb::CopyFunctionCatalogEntry_*,_false> local_38;
  _Head_base<0UL,_duckdb::CopyFunctionCatalogEntry_*,_false> local_30;
  
  catalog = (this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog;
  this_00 = (CopyFunctionCatalogEntry *)operator_new(0x3d0);
  CopyFunctionCatalogEntry::CopyFunctionCatalogEntry
            (this_00,catalog,&this->super_SchemaCatalogEntry,info);
  bVar1 = (info->super_CreateInfo).internal;
  local_30._M_head_impl = this_00;
  pCVar2 = unique_ptr<duckdb::CopyFunctionCatalogEntry,_std::default_delete<duckdb::CopyFunctionCatalogEntry>,_true>
           ::operator->((unique_ptr<duckdb::CopyFunctionCatalogEntry,_std::default_delete<duckdb::CopyFunctionCatalogEntry>,_true>
                         *)&local_30);
  local_38._M_head_impl = local_30._M_head_impl;
  (pCVar2->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.internal = bVar1;
  local_30._M_head_impl = (CopyFunctionCatalogEntry *)0x0;
  oVar3 = AddEntry(this,transaction,
                   (unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true>
                    *)&local_38,(info->super_CreateInfo).on_conflict);
  if (local_38._M_head_impl != (CopyFunctionCatalogEntry *)0x0) {
    (*((local_38._M_head_impl)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
      _vptr_CatalogEntry[1])();
  }
  local_38._M_head_impl = (CopyFunctionCatalogEntry *)0x0;
  if (local_30._M_head_impl != (CopyFunctionCatalogEntry *)0x0) {
    (*((local_30._M_head_impl)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
      _vptr_CatalogEntry[1])();
  }
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar3.ptr;
}

Assistant:

optional_ptr<CatalogEntry> DuckSchemaEntry::CreateCopyFunction(CatalogTransaction transaction,
                                                               CreateCopyFunctionInfo &info) {
	auto copy_function = make_uniq<CopyFunctionCatalogEntry>(catalog, *this, info);
	copy_function->internal = info.internal;
	return AddEntry(transaction, std::move(copy_function), info.on_conflict);
}